

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plt-elf.c
# Opt level: O0

size_t get_offsets(plt_ctx ctx,plt_lib lib,char *name,plt_offset **offsets)

{
  Elf64_Addr EVar1;
  Elf64_Sym *symtab_00;
  char *strtab_00;
  void *pvVar2;
  Elf64_Rel *pEVar3;
  uintptr_t uVar4;
  plt_offset *ppVar5;
  uintptr_t off;
  size_t i;
  rel_info info [2];
  size_t n;
  Elf64_Addr base;
  Elf64_Rel *rel;
  ElfWord rel_sz;
  ElfWord relent_sz;
  ElfWord jmprel_sz;
  Elf64_Rel *jmprel;
  char *strtab;
  Elf64_Sym *symtab;
  plt_offset **offsets_local;
  char *name_local;
  plt_lib lib_local;
  plt_ctx ctx_local;
  
  symtab_00 = (Elf64_Sym *)lib_dt_lookup(lib,6);
  strtab_00 = (char *)lib_dt_lookup(lib,5);
  pvVar2 = lib_dt_lookup(lib,0x17);
  pEVar3 = (Elf64_Rel *)lib_dt_lookup_val(lib,2);
  base = (Elf64_Addr)lib_dt_lookup(lib,7);
  if ((void *)base == (void *)0x0) {
    base = (Elf64_Addr)lib_dt_lookup(lib,0x11);
    if ((void *)base == (void *)0x0) {
      return 0;
    }
    rel = (Elf64_Rel *)lib_dt_lookup_val(lib,0x12);
    rel_sz = lib_dt_lookup_val(lib,0x13);
  }
  else {
    rel = (Elf64_Rel *)lib_dt_lookup_val(lib,8);
    rel_sz = lib_dt_lookup_val(lib,9);
  }
  if ((((symtab_00 == (Elf64_Sym *)0x0) || (strtab_00 == (char *)0x0)) ||
      ((base == 0 && (pvVar2 == (void *)0x0)))) ||
     (((rel == (Elf64_Rel *)0x0 && (pEVar3 == (Elf64_Rel *)0x0)) || (rel_sz == 0)))) {
    ctx_local = (plt_ctx)0x0;
  }
  else {
    EVar1 = lib->l_addr;
    info[1].entry_sz = 0;
    if (offsets != (plt_offset **)0x0) {
      *offsets = (plt_offset *)0x0;
    }
    info[0].tab = rel;
    info[0].size = rel_sz;
    info[1].size = rel_sz;
    info[0].entry_sz = (ElfWord)pvVar2;
    info[1].tab = pEVar3;
    for (off = 0; off < 2; off = off + 1) {
      uVar4 = get_offset((rel_info *)&info[off - 1].entry_sz,symtab_00,strtab_00,name);
      if (uVar4 != 0) {
        if (offsets != (plt_offset **)0x0) {
          ppVar5 = (plt_offset *)mmk_realloc(*offsets,(info[1].entry_sz + 1) * 0x10);
          *offsets = ppVar5;
          ppVar5 = *offsets;
          ppVar5[info[1].entry_sz].offset = (undefined1 **)(EVar1 + uVar4);
          ppVar5[info[1].entry_sz].oldval = (undefined1 *)0x0;
        }
        info[1].entry_sz = info[1].entry_sz + 1;
      }
    }
    ctx_local = (plt_ctx)info[1].entry_sz;
  }
  return (size_t)ctx_local;
}

Assistant:

static size_t get_offsets(plt_ctx ctx, plt_lib lib, const char *name, plt_offset ** offsets)
{
    ElfW(Sym) *symtab   = (ElfW(Sym)*)  lib_dt_lookup(lib, DT_SYMTAB);
    const char *strtab  = (const char*) lib_dt_lookup(lib, DT_STRTAB);

    ElfW(Rel)   *jmprel = lib_dt_lookup(lib, DT_JMPREL);

    ElfWord jmprel_sz = lib_dt_lookup_val(lib, DT_PLTRELSZ);
    ElfWord relent_sz;
    ElfWord rel_sz;

    // For relocation sections try DT_RELA first, then DT_REL. We don't deal with
    // addends anyway.
    ElfW(Rel) *rel = lib_dt_lookup(lib, DT_RELA);
    if (!rel) {
        rel = lib_dt_lookup(lib, DT_REL);
        if (!rel)
            return 0;
        rel_sz = lib_dt_lookup_val(lib, DT_RELSZ);
        relent_sz = lib_dt_lookup_val(lib, DT_RELENT);
    } else {
        rel_sz = lib_dt_lookup_val(lib, DT_RELASZ);
        relent_sz = lib_dt_lookup_val(lib, DT_RELAENT);
    }

    if (!symtab || !strtab || !(rel || jmprel) || !(rel_sz || jmprel_sz) || !relent_sz)
        return 0;

    ElfW(Addr) base = (ElfW(Addr)) lib->l_addr;
#ifdef __FreeBSD__
    if (lib == ctx->r_map)
        base = 0;
#endif

    size_t n = 0;
    if (offsets) {
        *offsets = NULL;
    }

    struct rel_info info[] = {
        {
          .tab = rel,
          .size = rel_sz,
          .entry_sz = relent_sz,
        },
        {
          .tab = jmprel,
          .size = jmprel_sz,
          .entry_sz = relent_sz,
        }
    };

    for (size_t i = 0; i < sizeof(info) / sizeof(struct rel_info); ++i) {
        uintptr_t off = get_offset(&info[i], symtab, strtab, name);
        if (off) {
            if (offsets) {
                *offsets = mmk_realloc(*offsets, (n + 1) * sizeof(plt_offset));
                (*offsets)[n] = (plt_offset) { .offset = (plt_fn **)(base + off) };
            }
            ++n;
        }
    }

    return n;
}